

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::CanonicalizationState::updateUses
          (CanonicalizationState *this,ReplacementMap *replacements,
          unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
          *info)

{
  bool bVar1;
  pointer pHVar2;
  pointer ppVar3;
  HeapType ht;
  HeapTypeInfo *pHVar4;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
  local_b0;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
  local_a8;
  iterator it;
  HeapType super;
  ChildUpdater local_88;
  HeapType local_28;
  HeapType root;
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  *info_local;
  ReplacementMap *replacements_local;
  CanonicalizationState *this_local;
  
  root.id = (uintptr_t)info;
  bVar1 = std::
          unordered_map<wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>_>
          ::empty(replacements);
  if (!bVar1) {
    local_28 = asHeapType(root.id);
    wasm::(anonymous_namespace)::CanonicalizationState::updateUses(std::unordered_map<wasm::
    HeapType,wasm::(anonymous_namespace)::CanonicalizationState::Replacement,std::hash<wasm::
    HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
    (anonymous_namespace)::CanonicalizationState::Replacement>>>&,std::unique_ptr<wasm::
    (anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::
    HeapTypeInfo>>&)::ChildUpdater::ChildUpdater(std::unordered_map<wasm::HeapType,wasm::
    (anonymous_namespace)::CanonicalizationState::Replacement,std::hash<wasm::HeapType>,std::
    equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
    (anonymous_namespace)::CanonicalizationState::Replacement>_>_>__(&local_88,replacements);
    TypeGraphWalkerBase<ChildUpdater>::walkRoot
              ((TypeGraphWalkerBase<ChildUpdater> *)&local_88,&local_28);
    updateUses::ChildUpdater::~ChildUpdater(&local_88);
    pHVar2 = std::
             unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
             ::operator->((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                           *)root.id);
    if (pHVar2->supertype != (HeapTypeInfo *)0x0) {
      pHVar2 = std::
               unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
               ::operator->((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                             *)root.id);
      HeapType::HeapType((HeapType *)&it,(TypeID)pHVar2->supertype);
      local_a8._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>_>
           ::find(replacements,(key_type *)&it);
      local_b0._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>_>
           ::end(replacements);
      bVar1 = std::__detail::operator!=(&local_a8,&local_b0);
      if (bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_false,_true>
                               *)&local_a8);
        ht = Replacement::getAsHeapType(&ppVar3->second);
        pHVar4 = getHeapTypeInfo(ht);
        pHVar2 = std::
                 unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 ::operator->((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                               *)root.id);
        pHVar2->supertype = pHVar4;
      }
    }
  }
  return;
}

Assistant:

void CanonicalizationState::updateUses(ReplacementMap& replacements,
                                       std::unique_ptr<HeapTypeInfo>& info) {
  if (replacements.empty()) {
    return;
  }
  // Replace all old types reachable from `info`.
  struct ChildUpdater : HeapTypeChildWalker<ChildUpdater> {
    ReplacementMap& replacements;
    ChildUpdater(ReplacementMap& replacements) : replacements(replacements) {}
    void noteChild(HeapType* child) {
      if (auto it = replacements.find(*child); it != replacements.end()) {
        *child = it->second.getAsHeapType();
      }
    }
  };
  HeapType root = asHeapType(info);
  ChildUpdater(replacements).walkRoot(&root);

  // We may need to update its supertype as well.
  if (info->supertype) {
    HeapType super(uintptr_t(info->supertype));
    if (auto it = replacements.find(super); it != replacements.end()) {
      info->supertype = getHeapTypeInfo(it->second.getAsHeapType());
    }
  }
}